

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_QuakeEx(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  int intensityX_00;
  int intensityY_00;
  int intensityZ_00;
  int duration_00;
  AActor *activator;
  int tremrad_00;
  FSoundID damrad_00;
  VMValue *pVVar1;
  bool bVar2;
  bool local_af;
  FSoundID local_ac;
  double local_a8;
  double rollWave;
  double rollIntensity;
  int highpoint;
  int falloff;
  double mulWaveZ;
  double mulWaveY;
  double mulWaveX;
  int flags;
  FSoundID local_6c;
  int local_68;
  FSoundID sound;
  int tremrad;
  int damrad;
  int duration;
  int intensityZ;
  int intensityY;
  int intensityX;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x143d,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x143d,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  activator = (AActor *)(param->field_0).field_1.a;
  local_af = true;
  if (activator != (AActor *)0x0) {
    local_af = DObject::IsKindOf((DObject *)activator,AActor::RegistrationInfo.MyClass);
  }
  if (local_af == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x143d,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x143e,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x143e,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  intensityX_00 = param[1].field_0.i;
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x143f,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x143f,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  intensityY_00 = param[2].field_0.i;
  if (numparam < 4) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1440,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[3].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1440,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  intensityZ_00 = param[3].field_0.i;
  if (numparam < 5) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1441,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[4].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1441,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  duration_00 = param[4].field_0.i;
  if (numparam < 6) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1442,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[5].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1442,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  sound.ID = *(int *)&param[5].field_0;
  if (numparam < 7) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1443,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[6].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1443,
                  "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  local_68 = param[6].field_0.i;
  FSoundID::FSoundID(&local_6c);
  if (numparam < 8) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1444,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
    FSoundID::FSoundID((FSoundID *)((long)&mulWaveX + 4),(pVVar1->field_0).i);
    FSoundID::operator=(&local_6c,(FSoundID *)((long)&mulWaveX + 4));
  }
  else {
    if (param[7].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1444,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    FSoundID::FSoundID((FSoundID *)&flags,param[7].field_0.i);
    FSoundID::operator=(&local_6c,(FSoundID *)&flags);
  }
  if (numparam < 9) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1445,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
    mulWaveX._0_4_ = (pVVar1->field_0).i;
  }
  else {
    if (param[8].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1445,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    mulWaveX._0_4_ = param[8].field_0.i;
  }
  if (numparam < 10) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
    if ((pVVar1->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1446,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
    mulWaveY = (pVVar1->field_0).f;
  }
  else {
    if (param[9].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1446,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    mulWaveY = param[9].field_0.f;
  }
  if (numparam < 0xb) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,10);
    if ((pVVar1->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1447,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,10);
    mulWaveZ = (pVVar1->field_0).f;
  }
  else {
    if (param[10].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1447,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    mulWaveZ = param[10].field_0.f;
  }
  if (numparam < 0xc) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xb);
    if ((pVVar1->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1448,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xb);
    _highpoint = (pVVar1->field_0).field_1.a;
  }
  else {
    if (param[0xb].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1448,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    _highpoint = param[0xb].field_0.field_1.a;
  }
  if (numparam < 0xd) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xc);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1449,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xc);
    rollIntensity._4_4_ = (pVVar1->field_0).i;
  }
  else {
    if (param[0xc].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1449,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    rollIntensity._4_4_ = param[0xc].field_0.i;
  }
  if (numparam < 0xe) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xd);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x144a,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xd);
    rollIntensity._0_4_ = (pVVar1->field_0).i;
  }
  else {
    if (param[0xd].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x144a,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    rollIntensity._0_4_ = param[0xd].field_0.i;
  }
  if (numparam < 0xf) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xe);
    if ((pVVar1->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x144b,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xe);
    rollWave = (pVVar1->field_0).f;
  }
  else {
    if (param[0xe].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x144b,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    rollWave = param[0xe].field_0.f;
  }
  if (numparam < 0x10) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xf);
    if ((pVVar1->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x144c,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xf);
    local_a8 = (pVVar1->field_0).f;
  }
  else {
    if (param[0xf].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x144c,
                    "int AF_AActor_A_QuakeEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_a8 = param[0xf].field_0.f;
  }
  damrad_00.ID = sound.ID;
  tremrad_00 = local_68;
  FSoundID::FSoundID(&local_ac,&local_6c);
  P_StartQuakeXYZ(activator,0,intensityX_00,intensityY_00,intensityZ_00,duration_00,damrad_00.ID,
                  tremrad_00,&local_ac,mulWaveX._0_4_,mulWaveY,mulWaveZ,(double)_highpoint,
                  rollIntensity._4_4_,rollIntensity._0_4_,rollWave,local_a8);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_QuakeEx)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(intensityX);
	PARAM_INT(intensityY);
	PARAM_INT(intensityZ);
	PARAM_INT(duration);
	PARAM_INT(damrad);
	PARAM_INT(tremrad);
	PARAM_SOUND_DEF(sound);
	PARAM_INT_DEF(flags);
	PARAM_FLOAT_DEF(mulWaveX);
	PARAM_FLOAT_DEF(mulWaveY);
	PARAM_FLOAT_DEF(mulWaveZ);
	PARAM_INT_DEF(falloff);
	PARAM_INT_DEF(highpoint);
	PARAM_FLOAT_DEF(rollIntensity);
	PARAM_FLOAT_DEF(rollWave);
	P_StartQuakeXYZ(self, 0, intensityX, intensityY, intensityZ, duration, damrad, tremrad, sound, flags, mulWaveX, mulWaveY, mulWaveZ, falloff, highpoint, 
		rollIntensity, rollWave);
	return 0;
}